

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O2

void __thiscall skiwi::anon_unknown_23::apply::test(apply *this)

{
  int in_R8D;
  int iVar1;
  allocator<char> local_4c9;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  compile_fixture::build_string_to_symbol(&this->super_compile_fixture);
  compile_fixture::build_apply(&this->super_compile_fixture);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"(apply + ())",&local_4c9)
  ;
  compile_fixture::run(&local_28,&this->super_compile_fixture,&local_4c8,true,in_R8D);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xcfe,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(apply + (list 3 4))",&local_4c9);
  compile_fixture::run(&local_48,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("7",&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xcff,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(apply + (list 1 2 3 4))",&local_4c9);
  compile_fixture::run(&local_68,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("10",&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd00,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(apply + 1 2 (list 3 4))",&local_4c9);
  compile_fixture::run(&local_88,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("10",&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd01,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(apply + (list 1 2 3 4 5 6 7 8))",&local_4c9);
  compile_fixture::run(&local_a8,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("36",&local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd02,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(apply + (list 1 2 3 4 5 6 7 8 9))",&local_4c9);
  compile_fixture::run(&local_c8,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("45",&local_c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd03,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(apply + (list 1 2 3 4 5 6 7 8 9 10))",&local_4c9);
  compile_fixture::run(&local_e8,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("55",&local_e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd04,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(%apply + 1 2 3 4 5 6 7 8 9 (list 10))",&local_4c9);
  compile_fixture::run(&local_108,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("55",&local_108,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd05,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(cons(apply vector \'(1 2 3 4 5 6 7 8)) \'())",&local_4c9);
  compile_fixture::run(&local_128,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("(#(1 2 3 4 5 6 7 8))",&local_128,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd07,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(cons(apply vector 1 \'(2 3 4 5 6 7 8)) \'())",&local_4c9);
  compile_fixture::run(&local_148,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("(#(1 2 3 4 5 6 7 8))",&local_148,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd08,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(cons(apply vector 1 2 \'(3 4 5 6 7 8)) \'())",&local_4c9);
  compile_fixture::run(&local_168,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("(#(1 2 3 4 5 6 7 8))",&local_168,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd09,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(cons(apply vector 1 2 3 \'(4 5 6 7 8)) \'())",&local_4c9);
  compile_fixture::run(&local_188,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("(#(1 2 3 4 5 6 7 8))",&local_188,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd0a,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(cons(apply vector 1 2 3 4 \'(5 6 7 8)) \'())",&local_4c9);
  compile_fixture::run(&local_1a8,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("(#(1 2 3 4 5 6 7 8))",&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd0b,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(cons(apply vector 1 2 3 4 5 \'(6 7 8)) \'())",&local_4c9);
  compile_fixture::run(&local_1c8,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("(#(1 2 3 4 5 6 7 8))",&local_1c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd0c,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(cons(apply vector 1 2 3 4 5 6 \'(7 8)) \'())",&local_4c9);
  compile_fixture::run(&local_1e8,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("(#(1 2 3 4 5 6 7 8))",&local_1e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd0d,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(cons(apply vector 1 2 3 4 5 6 7 \'(8)) \'())",&local_4c9);
  compile_fixture::run(&local_208,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("(#(1 2 3 4 5 6 7 8))",&local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd0e,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(cons(apply vector 1 2 3 4 5 6 7 8 ()) \'())",&local_4c9);
  compile_fixture::run(&local_228,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("(#(1 2 3 4 5 6 7 8))",&local_228,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd0f,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(let([f(lambda() 12)])( + (apply f \'()) 1))",&local_4c9);
  compile_fixture::run(&local_248,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("13",&local_248,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd11,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(let([f(lambda(x) ( + x 12))]) ( + (apply f 13 \'()) 1))",
             &local_4c9);
  compile_fixture::run(&local_268,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("26",&local_268,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd12,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(let([f(lambda(x) ( + x 12))]) ( + (apply f(cons 13 \'())) 1))",
             &local_4c9);
  compile_fixture::run(&local_288,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("26",&local_288,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd13,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,
             "(let([f(lambda(x y z) ( + x(* y z)))])( + (apply f 12 \'(7 2)) 1))",&local_4c9);
  compile_fixture::run(&local_2a8,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("27",&local_2a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd14,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(let([f(lambda() 12)])(apply f \'()))",&local_4c9);
  compile_fixture::run(&local_2c8,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("12",&local_2c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd16,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(let([f(lambda(x) ( + x 12))])(apply f 13 \'()))",&local_4c9);
  compile_fixture::run(&local_2e8,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("25",&local_2e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd17,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(let([f(lambda(x) ( + x 12))])(apply f(cons 13 \'())))",
             &local_4c9);
  compile_fixture::run(&local_308,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("25",&local_308,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd18,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(let([f(lambda(x y z) ( + x(* y z)))])(apply f 12 \'(7 2)))",
             &local_4c9);
  compile_fixture::run(&local_328,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("26",&local_328,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd19,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(apply vector \'(1 2 3 4 5 6 7 8))",&local_4c9);
  compile_fixture::run(&local_348,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("#(1 2 3 4 5 6 7 8)",&local_348,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd1a,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(apply vector 1 \'(2 3 4 5 6 7 8))",&local_4c9);
  compile_fixture::run(&local_368,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("#(1 2 3 4 5 6 7 8)",&local_368,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd1b,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(apply vector 1 2 \'(3 4 5 6 7 8)) ",&local_4c9);
  compile_fixture::run(&local_388,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("#(1 2 3 4 5 6 7 8)",&local_388,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd1c,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(apply vector 1 2 3 \'(4 5 6 7 8)) ",&local_4c9);
  compile_fixture::run(&local_3a8,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("#(1 2 3 4 5 6 7 8)",&local_3a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd1d,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(apply vector 1 2 3 4 \'(5 6 7 8)) ",&local_4c9);
  compile_fixture::run(&local_3c8,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("#(1 2 3 4 5 6 7 8)",&local_3c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd1e,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(apply vector 1 2 3 4 5 \'(6 7 8)) ",&local_4c9);
  compile_fixture::run(&local_3e8,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("#(1 2 3 4 5 6 7 8)",&local_3e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd1f,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(apply vector 1 2 3 4 5 6 \'(7 8)) ",&local_4c9);
  compile_fixture::run(&local_408,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("#(1 2 3 4 5 6 7 8)",&local_408,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd20,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(apply vector 1 2 3 4 5 6 7 \'(8)) ",&local_4c9);
  compile_fixture::run(&local_428,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("#(1 2 3 4 5 6 7 8)",&local_428,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd21,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(apply vector 1 2 3 4 5 6 7 8 ())",&local_4c9);
  compile_fixture::run(&local_448,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("#(1 2 3 4 5 6 7 8)",&local_448,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd22,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(define compose (lambda(f g)(lambda args(f(apply g args)))))",
             &local_4c9);
  compile_fixture::run(&local_468,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("<lambda>",&local_468,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd25,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"(define twice (lambda (x) (* 2 x)))",&local_4c9);
  compile_fixture::run(&local_488,&this->super_compile_fixture,&local_4c8,true,iVar1);
  iVar1 = 0x1c121e;
  TestEq<char_const*,std::__cxx11::string>
            ("<lambda>",&local_488,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd26,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"((compose twice *) 12 75)",&local_4c9);
  compile_fixture::run(&local_4a8,&this->super_compile_fixture,&local_4c8,true,iVar1);
  TestEq<char_const*,std::__cxx11::string>
            ("1800",&local_4a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd27,"void skiwi::(anonymous namespace)::apply::test()");
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_4c8);
  return;
}

Assistant:

void test()
      {
      build_string_to_symbol();
      build_apply();
      TEST_EQ("0", run("(apply + ())"));
      TEST_EQ("7", run("(apply + (list 3 4))"));
      TEST_EQ("10", run("(apply + (list 1 2 3 4))"));
      TEST_EQ("10", run("(apply + 1 2 (list 3 4))"));
      TEST_EQ("36", run("(apply + (list 1 2 3 4 5 6 7 8))"));
      TEST_EQ("45", run("(apply + (list 1 2 3 4 5 6 7 8 9))"));
      TEST_EQ("55", run("(apply + (list 1 2 3 4 5 6 7 8 9 10))"));
      TEST_EQ("55", run("(%apply + 1 2 3 4 5 6 7 8 9 (list 10))"));

      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector '(1 2 3 4 5 6 7 8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 '(2 3 4 5 6 7 8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 2 '(3 4 5 6 7 8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 2 3 '(4 5 6 7 8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 2 3 4 '(5 6 7 8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 2 3 4 5 '(6 7 8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 2 3 4 5 6 '(7 8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 2 3 4 5 6 7 '(8)) '())"));
      TEST_EQ("(#(1 2 3 4 5 6 7 8))", run("(cons(apply vector 1 2 3 4 5 6 7 8 ()) '())"));

      TEST_EQ("13", run("(let([f(lambda() 12)])( + (apply f '()) 1))"));
      TEST_EQ("26", run("(let([f(lambda(x) ( + x 12))]) ( + (apply f 13 '()) 1))"));
      TEST_EQ("26", run("(let([f(lambda(x) ( + x 12))]) ( + (apply f(cons 13 '())) 1))"));
      TEST_EQ("27", run("(let([f(lambda(x y z) ( + x(* y z)))])( + (apply f 12 '(7 2)) 1))"));

      TEST_EQ("12", run("(let([f(lambda() 12)])(apply f '()))"));
      TEST_EQ("25", run("(let([f(lambda(x) ( + x 12))])(apply f 13 '()))"));
      TEST_EQ("25", run("(let([f(lambda(x) ( + x 12))])(apply f(cons 13 '())))"));
      TEST_EQ("26", run("(let([f(lambda(x y z) ( + x(* y z)))])(apply f 12 '(7 2)))"));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector '(1 2 3 4 5 6 7 8))"));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 '(2 3 4 5 6 7 8))"));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 2 '(3 4 5 6 7 8)) "));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 2 3 '(4 5 6 7 8)) "));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 2 3 4 '(5 6 7 8)) "));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 2 3 4 5 '(6 7 8)) "));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 2 3 4 5 6 '(7 8)) "));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 2 3 4 5 6 7 '(8)) "));
      TEST_EQ("#(1 2 3 4 5 6 7 8)", run("(apply vector 1 2 3 4 5 6 7 8 ())"));


      TEST_EQ("<lambda>", run("(define compose (lambda(f g)(lambda args(f(apply g args)))))"));
      TEST_EQ("<lambda>", run("(define twice (lambda (x) (* 2 x)))"));
      TEST_EQ("1800", run("((compose twice *) 12 75)"));
      }